

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Location * __thiscall wabt::WastLexer::GetLocation(Location *__return_storage_ptr__,WastLexer *this)

{
  int line;
  int first_column;
  int last_column;
  string_view local_28;
  anon_class_8_1_8991fb9c local_18;
  anon_class_8_1_8991fb9c column;
  WastLexer *this_local;
  
  local_18.this = this;
  column.this = this;
  string_view::string_view(&local_28,&this->filename_);
  line = this->line_;
  first_column = GetLocation::anon_class_8_1_8991fb9c::operator()(&local_18,this->token_start_);
  last_column = GetLocation::anon_class_8_1_8991fb9c::operator()(&local_18,this->cursor_);
  Location::Location(__return_storage_ptr__,local_28,line,first_column,last_column);
  return __return_storage_ptr__;
}

Assistant:

Location WastLexer::GetLocation() {
  auto column = [=](const char* p) {
    return std::max(1, static_cast<int>(p - line_start_ + 1));
  };
  return Location(filename_, line_, column(token_start_), column(cursor_));
}